

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_SubDEdgePtrLink>::Append
          (ON_SimpleArray<ON_SubDEdgePtrLink> *this,ON_SubDEdgePtrLink *x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ON_SubDEdgePtrLink *pOVar4;
  ON_SubDEdgePtrLink *pOVar5;
  
  iVar3 = this->m_count;
  pOVar4 = x;
  if (iVar3 == this->m_capacity) {
    iVar3 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar4 = (ON_SubDEdgePtrLink *)onmalloc(0x10);
      uVar1 = x->m_index;
      uVar2 = x->m_nbr_index;
      (pOVar4->m_ep).m_ptr = (x->m_ep).m_ptr;
      pOVar4->m_index = uVar1;
      pOVar4->m_nbr_index = uVar2;
    }
    Reserve(this,(long)iVar3);
    pOVar5 = this->m_a;
    if (pOVar5 == (ON_SubDEdgePtrLink *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar3 = this->m_count;
  }
  else {
    pOVar5 = this->m_a;
  }
  this->m_count = iVar3 + 1;
  uVar1 = pOVar4->m_index;
  uVar2 = pOVar4->m_nbr_index;
  pOVar5 = pOVar5 + iVar3;
  (pOVar5->m_ep).m_ptr = (pOVar4->m_ep).m_ptr;
  pOVar5->m_index = uVar1;
  pOVar5->m_nbr_index = uVar2;
  if (pOVar4 != x) {
    onfree(pOVar4);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}